

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

bool __thiscall FTraceInfo::TraceTraverse(FTraceInfo *this,int ptflags)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  extsector_t *peVar6;
  F3DFloor **ppFVar7;
  F3DFloor *pFVar8;
  secplane_t *psVar9;
  FTraceResults *pFVar10;
  sector_t_conflict *psVar11;
  AActor *pAVar12;
  vertex_t *pvVar13;
  FTraceResults *pFVar14;
  bool bVar15;
  bool bVar16;
  intercept_t *in;
  ETraceResult EVar17;
  FLinePortal *pFVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  FTraceResults *res;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  FPathTraverse it;
  FTraceResults hsecResult;
  DVector3 local_170;
  DVector3 local_158;
  FPathTraverse local_140;
  FTraceResults local_100;
  
  Setup3DFloors(this);
  local_140._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fe0c8;
  FPathTraverse::init(&local_140,(EVP_PKEY_CTX *)(ulong)(ptflags | 8));
  iVar20 = -1;
LAB_0045e4b8:
  do {
    in = FPathTraverse::Next(&local_140);
    if (in == (intercept_t *)0x0) break;
    if ((this->Results->Crossed3DWater == (F3DFloor *)0x0) && (iVar20 != this->CurSector->sectornum)
       ) {
      peVar6 = this->CurSector->e;
      uVar21 = (ulong)(peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar21 != 0) {
        ppFVar7 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
        lVar19 = 0;
        do {
          pFVar8 = *(F3DFloor **)((long)ppFVar7 + lVar19);
          if ((~pFVar8->flags & 0x11) == 0) {
            bVar16 = CheckPlane(this,(pFVar8->top).plane);
            if (bVar16) {
              psVar9 = (pFVar8->top).plane;
              pFVar10 = this->Results;
              psVar11 = this->CurSector;
              dVar1 = (pFVar10->HitPos).X;
              dVar2 = (pFVar10->HitPos).Y;
              if (((psVar11->floorplane).normal.Y * dVar2 +
                  (psVar11->floorplane).normal.X * dVar1 + (psVar11->floorplane).D) *
                  (psVar11->floorplane).negiC <
                  ((psVar9->normal).Y * dVar2 + (psVar9->normal).X * dVar1 + psVar9->D) *
                  psVar9->negiC) {
                pFVar10->Crossed3DWater = pFVar8;
                (pFVar10->Crossed3DWaterPos).Z = (pFVar10->HitPos).Z;
                (pFVar10->Crossed3DWaterPos).Y = dVar2;
                (pFVar10->Crossed3DWaterPos).X = dVar1;
                pFVar10->Distance = 0.0;
              }
            }
          }
          lVar19 = lVar19 + 8;
        } while (uVar21 << 3 != lVar19);
      }
      iVar20 = this->CurSector->sectornum;
    }
    dVar1 = this->MaxDist;
    dVar22 = in->frac * dVar1;
    dVar2 = (this->Start).Z;
    dVar3 = (this->Vec).Z;
    dVar24 = (this->Vec).X * dVar22 + (this->Start).X;
    dVar25 = (this->Vec).Y * dVar22 + (this->Start).Y;
    dVar23 = dVar22 * dVar3 + dVar2;
    if ((0.0 <= dVar3) || (psVar11 = this->CurSector, (psVar11->planes[0].Flags & 0x1d0U) != 0x100))
    {
      if ((0.0 < dVar3) &&
         (((psVar11 = this->CurSector, (psVar11->planes[1].Flags & 0x1d0U) == 0x100 &&
           (dVar4 = sectorPortals.Array[psVar11->Portals[1]].mPlaneZ, dVar4 < dVar23)) &&
          (this->limitz <= dVar4 && dVar4 != this->limitz)))) {
        this->limitz = dVar4;
        EnterSectorPortal(this,&local_140,1,(dVar4 - dVar2) / (dVar1 * dVar3),psVar11);
        goto LAB_0045e4b8;
      }
    }
    else {
      dVar4 = sectorPortals.Array[psVar11->Portals[0]].mPlaneZ;
      if ((dVar23 < dVar4) && (dVar4 < this->limitz)) {
        this->limitz = dVar4;
        EnterSectorPortal(this,&local_140,0,(dVar4 - dVar2) / (dVar1 * dVar3),psVar11);
        goto LAB_0045e4b8;
      }
    }
    pAVar12 = (AActor *)(in->d).line;
    if (in->isaline == true) {
      uVar5 = *(uint *)&(pAVar12->VisibleStartPitch).Degrees;
      if (((uVar5 < linePortals.Count) && ((linePortals.Array[uVar5].mFlags & 2) != 0)) &&
         (pvVar13 = (vertex_t *)(pAVar12->super_DThinker).super_DObject._vptr_DObject,
         ((pvVar13->p).X - (this->Start).X) * (double)(pAVar12->super_DThinker).super_DObject.GCNext
         + ((this->Start).Y - (pvVar13->p).Y) *
           ((DVector2 *)&(pAVar12->super_DThinker).super_DObject.ObjNext)->X <= 1.52587890625e-05))
      {
        psVar11 = (sector_t_conflict *)(pAVar12->SpriteRotation).Degrees;
        if ((psVar11 == (sector_t_conflict *)0x0) ||
           ((((psVar11->floorplane).normal.Y * dVar25 +
             (psVar11->floorplane).normal.X * dVar24 + (psVar11->floorplane).D) *
             (psVar11->floorplane).negiC <= dVar23 &&
            (dVar23 <= ((psVar11->ceilingplane).normal.Y * dVar25 +
                       (psVar11->ceilingplane).normal.X * dVar24 + (psVar11->ceilingplane).D) *
                       (psVar11->ceilingplane).negiC)))) {
          pFVar18 = linePortals.Array + uVar5;
          if (linePortals.Count <= uVar5) {
            pFVar18 = (FLinePortal *)0x0;
          }
          if ((pFVar18->mType == '\x03') || ((this->TraceFlags & 8) == 0)) {
            EnterLinePortal(this,&local_140,in);
            bVar15 = true;
            bVar16 = false;
          }
          else {
            bVar15 = false;
            bVar16 = true;
          }
          if (bVar16) goto LAB_0045e8b5;
        }
        else {
LAB_0045e8b5:
          bVar15 = false;
        }
        if (bVar15) goto LAB_0045e4b8;
      }
      local_158.X = dVar24;
      local_158.Y = dVar25;
      local_158.Z = dVar23;
      bVar16 = LineCheck(this,in,dVar22,&local_158);
    }
    else {
      if ((((this->ActorMask).Value & (pAVar12->flags).Value) == 0) || (pAVar12 == this->IgnoreThis)
         ) goto LAB_0045e4b8;
      local_170.X = dVar24;
      local_170.Y = dVar25;
      local_170.Z = dVar23;
      bVar16 = ThingCheck(this,in,dVar22,&local_170);
    }
  } while (bVar16 != false);
  if (this->Results->HitType != TRACE_HitNone) goto LAB_0045e985;
  if ((this->CurSector->planes[0].Flags & 0x1d0U) == 0x100) {
LAB_0045e942:
    if ((this->CurSector->planes[1].Flags & 0x1d0U) == 0x100) goto LAB_0045e985;
    bVar16 = CheckPlane(this,&this->CurSector->ceilingplane);
    if (!bVar16) goto LAB_0045e985;
    lVar19 = 0xa0;
    EVar17 = TRACE_HitCeiling;
  }
  else {
    bVar16 = CheckPlane(this,&this->CurSector->floorplane);
    if (!bVar16) goto LAB_0045e942;
    lVar19 = 0x48;
    EVar17 = TRACE_HitFloor;
  }
  pFVar10 = this->Results;
  pFVar10->HitType = EVar17;
  (pFVar10->HitTexture).texnum = *(int *)((long)&this->CurSector->planes[0].xform.xOffs + lVar19);
LAB_0045e985:
  psVar11 = this->CurSector;
  pFVar10 = this->Results;
  pFVar10->Sector = (sector_t *)(sectors + psVar11->sectornum);
  if ((pFVar10->CrossedWater == (sector_t *)0x0) &&
     (psVar11 = psVar11->heightsec, psVar11 != (sector_t_conflict *)0x0)) {
    dVar1 = (psVar11->floorplane).D;
    dVar2 = (psVar11->floorplane).normal.X;
    dVar3 = (psVar11->floorplane).normal.Y;
    dVar22 = (psVar11->floorplane).negiC;
    if ((((this->Start).Y * dVar3 + (this->Start).X * dVar2 + dVar1) * dVar22 < (this->Start).Z) &&
       ((pFVar10->HitPos).Z <=
        dVar22 * (dVar3 * (pFVar10->HitPos).Y + dVar1 + dVar2 * (pFVar10->HitPos).X))) {
      this->Results = &local_100;
      bVar16 = CheckPlane(this,&psVar11->floorplane);
      if (bVar16) {
        pFVar14 = this->Results;
        pFVar14->CrossedWater = (sector_t *)(sectors + this->CurSector->sectornum);
        (pFVar14->CrossedWaterPos).Z = (pFVar14->HitPos).Z;
        dVar1 = (pFVar14->HitPos).Y;
        (pFVar14->CrossedWaterPos).X = (pFVar14->HitPos).X;
        (pFVar14->CrossedWaterPos).Y = dVar1;
        pFVar14->Distance = 0.0;
      }
      this->Results = pFVar10;
    }
  }
  pFVar10 = this->Results;
  if (((pFVar10->HitType == TRACE_HitNone) && (pFVar10->Distance == 0.0)) &&
     (!NAN(pFVar10->Distance))) {
    dVar1 = this->MaxDist;
    dVar2 = (this->Vec).X;
    dVar3 = (this->Vec).Y;
    dVar22 = (this->Start).X;
    dVar23 = (this->Start).Y;
    (pFVar10->HitPos).Z = dVar1 * (this->Vec).Z + (this->Start).Z;
    (pFVar10->HitPos).Y = dVar3 * dVar1 + dVar23;
    (pFVar10->HitPos).X = dVar2 * dVar1 + dVar22;
    SetSourcePosition(this);
    pFVar10 = this->Results;
    pFVar10->Distance = this->MaxDist;
    pFVar10->Fraction = 1.0;
  }
  EVar17 = this->Results->HitType;
  FPathTraverse::~FPathTraverse(&local_140);
  return EVar17 != TRACE_HitNone;
}

Assistant:

bool FTraceInfo::TraceTraverse (int ptflags)
{
	// Do a 3D floor check in the starting sector
	Setup3DFloors();

	FPathTraverse it(Start.X, Start.Y, Vec.X * MaxDist, Vec.Y * MaxDist, ptflags | PT_DELTA, startfrac);
	intercept_t *in;
	int lastsplashsector = -1;

	while ((in = it.Next()))
	{
		// Deal with splashes in 3D floors (but only run once per sector, not each iteration - and stop if something was found.)
		if (Results->Crossed3DWater == NULL && lastsplashsector != CurSector->sectornum)
		{
			for (auto rover : CurSector->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_EXISTS) && (rover->flags&FF_SWIMMABLE))
				{
					if (Check3DFloorPlane(rover, false))
					{
						// only consider if the plane is above the actual floor.
						if (rover->top.plane->ZatPoint(Results->HitPos) > CurSector->floorplane.ZatPoint(Results->HitPos))
						{
							Results->Crossed3DWater = rover;
							Results->Crossed3DWaterPos = Results->HitPos;
							Results->Distance = 0;
						}
					}
				}
			}
			lastsplashsector = CurSector->sectornum;
		}

		double dist = MaxDist * in->frac;
		DVector3 hit = Start + Vec * dist;

		// Crossed a floor portal? 
		if (Vec.Z < 0 && !CurSector->PortalBlocksMovement(sector_t::floor))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::floor);
			if (hit.Z < portz && limitz > portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::floor, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}
		// ... or a ceiling portal?
		else if (Vec.Z > 0 && !CurSector->PortalBlocksMovement(sector_t::ceiling))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::ceiling);
			if (hit.Z > portz && limitz < portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::ceiling, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}

		if (in->isaline)
		{
			if (in->d.line->isLinePortal() && P_PointOnLineSidePrecise(Start, in->d.line) == 0)
			{
				sector_t *entersector = in->d.line->backsector;
				if (entersector == NULL || (hit.Z >= entersector->floorplane.ZatPoint(hit) && hit.Z <= entersector->ceilingplane.ZatPoint(hit)))
				{
					FLinePortal *port = in->d.line->getPortal();
					// The caller cannot handle portals without global offset.
					if (port->mType == PORTT_LINKED || !(TraceFlags & TRACE_PortalRestrict))
					{
						EnterLinePortal(it, in);
						continue;
					}
				}
			}
			if (!LineCheck(in, dist, hit)) break;
		}
		else if ((in->d.thing->flags & ActorMask) && in->d.thing != IgnoreThis)
		{
			if (!ThingCheck(in, dist, hit)) break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		if (CurSector->PortalBlocksMovement(sector_t::floor) && CheckSectorPlane(CurSector, true))
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else if (CurSector->PortalBlocksMovement(sector_t::ceiling) && CheckSectorPlane(CurSector, false))
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
	}

	// check for intersection with floor/ceiling
	Results->Sector = &sectors[CurSector->sectornum];

	if (Results->CrossedWater == NULL &&
		CurSector->heightsec != NULL &&
		CurSector->heightsec->floorplane.ZatPoint(Start) < Start.Z &&
		CurSector->heightsec->floorplane.ZatPoint(Results->HitPos) >= Results->HitPos.Z)
	{
		// Save the result so that the water check doesn't destroy it.
		FTraceResults *res = Results;
		FTraceResults hsecResult;
		Results = &hsecResult;

		if (CheckSectorPlane(CurSector->heightsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
		Results = res;
	}
	if (Results->HitType == TRACE_HitNone && Results->Distance == 0)
	{
		Results->HitPos = Start + Vec * MaxDist;
		SetSourcePosition();
		Results->Distance = MaxDist;
		Results->Fraction = 1.;
	}
	return Results->HitType != TRACE_HitNone;
}